

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
alloc_chunk_table(_internal_exr_context *ctxt,_internal_exr_part *part,uint64_t **chunktable)

{
  exr_result_t eVar1;
  size_t __n;
  void *pvVar2;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  uintptr_t nptr;
  uintptr_t eptr;
  uint64_t chunkbytes;
  uint64_t *ctable;
  void *local_28;
  
  local_28 = *(void **)(in_RSI + 0x100);
  if (*(void **)(in_RSI + 0x100) == (void *)0x0) {
    __n = (long)*(int *)(in_RSI + 0xf4) << 3;
    local_28 = (void *)(**(code **)(in_RDI + 0x58))(__n);
    if (local_28 == (void *)0x0) {
      eVar1 = (**(code **)(in_RDI + 0x38))(in_RDI,1);
      return eVar1;
    }
    memset(local_28,0,__n);
    LOCK();
    pvVar2 = *(void **)(in_RSI + 0x100);
    bVar3 = pvVar2 == (void *)0x0;
    if (bVar3) {
      *(void **)(in_RSI + 0x100) = local_28;
      pvVar2 = (void *)0x0;
    }
    UNLOCK();
    if ((!bVar3) &&
       ((**(code **)(in_RDI + 0x60))(local_28), local_28 = pvVar2, pvVar2 == (void *)0x0)) {
      eVar1 = (**(code **)(in_RDI + 0x38))(in_RDI,1);
      return eVar1;
    }
  }
  *in_RDX = (long)local_28;
  return 0;
}

Assistant:

static exr_result_t
alloc_chunk_table (
    const struct _internal_exr_context* ctxt,
    const struct _internal_exr_part*    part,
    uint64_t**                          chunktable)
{
    uint64_t* ctable = NULL;

    /* we have the lock, but to access the type, we'll use the atomic function anyway */
#if defined(_MSC_VER)
    ctable = (uint64_t*) InterlockedOr64 (
        (int64_t volatile*) &(part->chunk_table), 0);
#else
    ctable = (uint64_t*) atomic_load (
        EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)));
#endif

    if (ctable == NULL)
    {
        uint64_t  chunkbytes = sizeof (uint64_t) * (uint64_t) part->chunk_count;
        uintptr_t eptr = 0, nptr = 0;

        ctable = (uint64_t*) ctxt->alloc_fn (chunkbytes);
        if (ctable == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        memset (ctable, 0, chunkbytes);

        nptr = (uintptr_t) ctable;
        if (!atomic_compare_exchange_strong (
                EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)),
                &eptr,
                nptr))
        {
            ctxt->free_fn (ctable);
            ctable = (uint64_t*) eptr;
            if (ctable == NULL)
                return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }
    }
    *chunktable = ctable;
    return EXR_ERR_SUCCESS;
}